

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HaveBuildTreeRPATH(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  char *pcVar2;
  cmLinkImplementationLibraries *this_00;
  cmLinkImplementationLibraries *impl;
  string local_78;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"SKIP_BUILD_RPATH",&local_41);
  bVar1 = GetPropertyAsBool(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"BUILD_RPATH",(allocator<char> *)((long)&impl + 7));
    pcVar2 = GetProperty(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&impl + 7));
    if (pcVar2 == (char *)0x0) {
      this_00 = GetLinkImplementationLibraries(this,local_20);
      if (this_00 == (cmLinkImplementationLibraries *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::empty
                          (&this_00->Libraries);
        this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::HaveBuildTreeRPATH(const std::string& config) const
{
  if (this->GetPropertyAsBool("SKIP_BUILD_RPATH")) {
    return false;
  }
  if (this->GetProperty("BUILD_RPATH")) {
    return true;
  }
  if (cmLinkImplementationLibraries const* impl =
        this->GetLinkImplementationLibraries(config)) {
    return !impl->Libraries.empty();
  }
  return false;
}